

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ImU32 col;
  GLFWwindow *handle;
  GLubyte *__s;
  size_t sVar5;
  ImGuiIO *pIVar6;
  size_t sVar7;
  float2 *pfVar8;
  bool *pbVar9;
  State *other;
  ImDrawList *this;
  ImDrawData *draw_data;
  long lVar10;
  size_t i_1;
  char *pcVar11;
  size_t i;
  size_t sVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  double mouse_y;
  double mouse_x;
  ImColor color;
  ImVec2 local_e8;
  ImVec2 local_e0;
  double local_d8;
  double local_d0;
  float2 local_c8;
  undefined8 uStack_c0;
  float2 local_b8;
  undefined8 uStack_b0;
  State local_a8;
  
  iVar3 = glfwInit();
  iVar4 = 1;
  if (iVar3 != 0) {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    handle = glfwCreateWindow(0x280,0x1e0,"My Title",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      glfwSwapInterval(1);
      gladLoadGLLoader(glfwGetProcAddress);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OpenGL: ",8);
      __s = (*glad_glGetString)(0x1f02);
      if (__s == (GLubyte *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1dc1c8);
      }
      else {
        sVar5 = strlen((char *)__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      ImGui_ImplGlfw_InitForOpenGL(handle,true);
      ImGui_ImplOpenGL3_Init((char *)0x0);
      State::add_box(&state,(float2)0x42c8000042c80000);
      State::add_box(&state,(float2)0x4348000043c80000);
      push_undo_step();
      iVar3 = glfwWindowShouldClose(handle);
      if (iVar3 == 0) {
        bVar2 = false;
        do {
          glfwPollEvents();
          glfwGetCursorPos(handle,&local_d0,&local_d8);
          fVar13 = (float)local_d0;
          fVar14 = (float)local_d8;
          pIVar6 = ImGui::GetIO();
          bVar1 = pIVar6->WantCaptureMouse;
          if (((bVar1 == false) && (iVar3 = glfwGetMouseButton(handle,0), iVar3 == 1)) &&
             (sVar7 = bas::Vector<float2,_4UL,_bas::RawAllocator>::size(&state.box_positions),
             sVar7 != 0)) {
            sVar12 = 0;
            do {
              pfVar8 = bas::Vector<float2,_4UL,_bas::RawAllocator>::operator[]
                                 (&state.box_positions,sVar12);
              fVar19 = (*pfVar8).x;
              fVar18 = (*pfVar8).y;
              fVar15 = box_size.x + fVar19;
              fVar16 = box_size.y + fVar18;
              fVar17 = fVar15;
              if (fVar19 <= fVar15) {
                fVar17 = fVar19;
              }
              if (fVar17 <= fVar13) {
                if (fVar19 <= fVar15) {
                  fVar19 = fVar15;
                }
                if (fVar13 <= fVar19) {
                  fVar19 = fVar16;
                  if (fVar18 <= fVar16) {
                    fVar19 = fVar18;
                  }
                  if (fVar19 <= fVar14) {
                    if (fVar18 <= fVar16) {
                      fVar18 = fVar16;
                    }
                    if (fVar14 <= fVar18) {
                      pbVar9 = bas::Vector<bool,_4UL,_bas::RawAllocator>::operator[]
                                         (&state.box_selections,sVar12);
                      *pbVar9 = true;
                    }
                  }
                }
              }
              sVar12 = sVar12 + 1;
            } while (sVar7 != sVar12);
          }
          iVar3 = glfwGetKey(handle,0x5a);
          iVar4 = glfwGetKey(handle,0x155);
          if ((!bVar2 && iVar4 == 1) && iVar3 == 1) {
            sVar7 = bas::Vector<State,_4UL,_bas::RawAllocator>::size(&undo_stack.m_elements);
            if (sVar7 < 2) {
              lVar10 = 0x12;
              pcVar11 = "End of undo stack\n";
            }
            else {
              bas::Vector<State,_4UL,_bas::RawAllocator>::pop_last(&local_a8,&undo_stack.m_elements)
              ;
              bas::Vector<bool,_4UL,_bas::RawAllocator>::~Vector(&local_a8.box_selections);
              bas::Vector<float2,_4UL,_bas::RawAllocator>::~Vector(&local_a8.box_positions);
              other = bas::Stack<State,_4UL,_bas::RawAllocator>::peek(&undo_stack);
              if (other != &state) {
                bas::Vector<float2,_4UL,_bas::RawAllocator>::~Vector(&state.box_positions);
                bas::Vector<float2,4ul,bas::RawAllocator>::init_copy_from_other_vector<4ul>
                          ((Vector<float2,4ul,bas::RawAllocator> *)&state,&other->box_positions);
                bas::Vector<bool,_4UL,_bas::RawAllocator>::~Vector(&state.box_selections);
                bas::Vector<bool,4ul,bas::RawAllocator>::init_copy_from_other_vector<4ul>
                          ((Vector<bool,4ul,bas::RawAllocator> *)&state.box_selections,
                           &other->box_selections);
              }
              state.a = other->a;
              lVar10 = 0xe;
              pcVar11 = "Pop undo step\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,lVar10)
            ;
          }
          ImGui_ImplOpenGL3_NewFrame();
          ImGui_ImplGlfw_NewFrame();
          ImGui::NewFrame();
          this = ImGui::GetBackgroundDrawList();
          sVar7 = bas::Vector<float2,_4UL,_bas::RawAllocator>::size(&state.box_positions);
          if (sVar7 != 0) {
            sVar12 = 0;
            do {
              pfVar8 = bas::Vector<float2,_4UL,_bas::RawAllocator>::operator[]
                                 (&state.box_positions,sVar12);
              local_b8 = *pfVar8;
              uStack_b0 = 0;
              local_c8 = box_size;
              uStack_c0 = 0;
              local_a8.box_positions.m_begin = (float2 *)0x3ea0a0a13f66e6e8;
              local_a8.box_positions.m_end = (float2 *)0x3f8000003ea0a0a1;
              pbVar9 = bas::Vector<bool,_4UL,_bas::RawAllocator>::operator[]
                                 (&state.box_selections,sVar12);
              if (*pbVar9 == true) {
                local_a8.box_positions.m_begin =
                     (float2 *)
                     CONCAT44(local_a8.box_positions.m_begin._4_4_,
                              local_a8.box_positions.m_begin._0_4_ * 0.6);
              }
              fVar18 = local_c8.x + local_b8.x;
              fVar19 = local_c8.y + local_b8.y;
              fVar17 = local_b8.x;
              if (local_b8.x <= fVar18) {
                fVar17 = fVar18;
                fVar18 = local_b8.x;
              }
              fVar15 = local_b8.y;
              if (local_b8.y <= fVar19) {
                fVar15 = fVar19;
                fVar19 = local_b8.y;
              }
              if (((bVar1 == false) && (fVar18 <= fVar13)) &&
                 ((fVar13 <= fVar17 && ((fVar19 <= fVar14 && (fVar14 <= fVar15)))))) {
                local_a8.box_positions.m_begin =
                     (float2 *)
                     CONCAT44(local_a8.box_positions.m_begin._4_4_,
                              local_a8.box_positions.m_begin._0_4_ * 0.8);
              }
              local_e0.y = fVar15;
              local_e0.x = fVar18;
              local_e8.y = fVar19;
              local_e8.x = fVar17;
              col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&local_a8);
              ImDrawList::AddRectFilled(this,&local_e0,&local_e8,col,0.0,0xf);
              sVar12 = sVar12 + 1;
            } while (sVar7 != sVar12);
          }
          ImGui::Begin("Other Window",(bool *)0x0,0);
          ImGui::SliderInt("A",&state.a,0,100,"%d");
          bVar2 = ImGui::IsItemDeactivatedAfterEdit();
          if (bVar2) {
            push_undo_step();
          }
          ImGui::End();
          ImGui::Render();
          (*glad_glClear)(0x4100);
          draw_data = ImGui::GetDrawData();
          ImGui_ImplOpenGL3_RenderDrawData(draw_data);
          glfwSwapBuffers(handle);
          iVar4 = glfwWindowShouldClose(handle);
          bVar2 = iVar3 == 1;
        } while (iVar4 == 0);
      }
      ImGui_ImplGlfw_Shutdown();
      glfwDestroyWindow(handle);
      glfwTerminate();
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int main()
{
    if (!glfwInit()) {
        return 1;
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

    GLFWwindow *window = glfwCreateWindow(
        640, 480, "My Title", nullptr, nullptr);
    if (window == nullptr) {
        return 1;
    }
    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    gladLoadGLLoader((GLADloadproc)glfwGetProcAddress);
    std::cout << "OpenGL: " << glGetString(GL_VERSION) << "\n";

    ImGui::CreateContext();
    ImGui::StyleColorsDark();
    ImGui_ImplGlfw_InitForOpenGL(window, true);
    ImGui_ImplOpenGL3_Init(nullptr);

    bool z_was_down = false;

    // double last_mouse_x = 0.0f;
    // double last_mouse_y = 0.0f;

    state.add_box({100, 100});
    state.add_box({400, 200});
    push_undo_step();

    while (!glfwWindowShouldClose(window)) {
        glfwPollEvents();

        double mouse_x, mouse_y;
        glfwGetCursorPos(window, &mouse_x, &mouse_y);
        float2 mouse_position = {(float)mouse_x, (float)mouse_y};

        bool imgui_uses_mouse = ImGui::GetIO().WantCaptureMouse;

        if (!imgui_uses_mouse) {
            if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) ==
                GLFW_PRESS) {
                for (size_t i : state.box_positions.index_range()) {
                    if (state.get_box_rect(i).contains(mouse_position)) {
                        state.box_selections[i] = true;
                    }
                }
            }
        }

        bool z_is_down = is_key_down(window, GLFW_KEY_Z);

        if (is_key_down(window, GLFW_KEY_LEFT_CONTROL) && !z_was_down &&
            z_is_down) {
            pop_undo_step();
        }

        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplGlfw_NewFrame();

        ImGui::NewFrame();

        {
            ImDrawList *draw_list = ImGui::GetBackgroundDrawList();
            for (size_t i : state.box_positions.index_range()) {
                rectf box = state.get_box_rect(i);
                ImColor color = ImColor(230, 80, 80);
                if (state.box_selections[i]) {
                    color.Value.x *= 0.6f;
                }
                if (!imgui_uses_mouse && box.contains(mouse_position)) {
                    color.Value.x *= 0.8f;
                }

                draw_list->AddRectFilled(
                    to_im(box.upper_left()), to_im(box.lower_right()), color);
            }
        }

        // ImGui::SetNextWindowPos({0, 0});
        // int width, height;
        // glfwGetWindowSize(window, &width, &height);
        // ImGui::SetNextWindowSize({(float)width, (float)height});
        // ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 0.0f);

        // ImGui::Begin("My Window",
        //              nullptr,
        //              ImGuiWindowFlags_NoDecoration |
        //                  ImGuiWindowFlags_NoBringToFrontOnFocus |
        //                  ImGuiWindowFlags_NoInputs);

        // // rect_pos_x = mouse_x;
        // ImDrawList *draw_list = ImGui::GetWindowDrawList();
        // if (!ImGui::GetIO().WantCaptureMouse &&
        //     glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) ==
        //     GLFW_PRESS) { BAS_UNUSED_VAR(last_mouse_y); rect_pos_x +=
        //     mouse_x - last_mouse_x;
        // }

        // draw_list->AddRectFilled({rect_pos_x, 10},
        //                          {rect_pos_x + 100, 200},
        //                          ImColor(0.8f, 0.8f, 0.3f));
        // const char *text = "Hello World";
        // draw_list->AddText({rect_pos_x, 100}, IM_COL32_WHITE, text, text +
        // 8);

        // ImDrawList *foreground_list = ImGui::GetForegroundDrawList();
        // foreground_list->AddLine({0, 0}, {300, 300}, ImColor(255, 0, 0), 4);

        // ImGui::End();

        // ImGui::PopStyleVar();

        ImGui::Begin("Other Window");
        ImGui::SliderInt("A", &state.a, 0, 100);
        push_undo_after_edit();
        ImGui::End();

        ImGui::Render();

        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());
        glfwSwapBuffers(window);

        z_was_down = z_is_down;
        // last_mouse_x = mouse_x;
        // last_mouse_y = mouse_y;
    }

    ImGui_ImplGlfw_Shutdown();
    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}